

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall
Lodtalk::StackInterpreter::callPrimitiveHere(StackInterpreter *this,PrimitiveFunction primitive)

{
  StackInterpreterProxy proxy;
  InterpreterProxy local_18;
  StackInterpreter *local_10;
  
  local_18._vptr_InterpreterProxy = (_func_int **)&PTR_getContext_001715d8;
  this->primitiveHasFailed = false;
  local_10 = this;
  (*primitive)(&local_18);
  if (this->primitiveHasFailed == true) {
    setTemporary(this,this->argumentCount,(Oop)((long)this->primitiveErrorCode * 2 + 1));
  }
  return;
}

Assistant:

void callPrimitiveHere(PrimitiveFunction primitive)
    {
        StackInterpreterProxy proxy(this);

        // Reset the has failed flag.
        primitiveHasFailed = false;
        primitive(&proxy);

        // If the primitive has failed, store the error code in the first temporary.
        if(primitiveHasFailed)
            setTemporary(argumentCount, Oop::encodeSmallInteger(primitiveErrorCode));
    }